

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

void muladd(tc_uECC_word_t a,tc_uECC_word_t b,tc_uECC_word_t *r0,tc_uECC_word_t *r1,
           tc_uECC_word_t *r2)

{
  ulong uVar1;
  tc_uECC_dword_t r01;
  tc_uECC_dword_t p;
  tc_uECC_word_t *r2_local;
  tc_uECC_word_t *r1_local;
  tc_uECC_word_t *r0_local;
  tc_uECC_word_t b_local;
  tc_uECC_word_t a_local;
  
  uVar1 = (ulong)a * (ulong)b + CONCAT44(*r1,*r0);
  *r2 = (uint)(uVar1 < (ulong)a * (ulong)b) + *r2;
  *r1 = (tc_uECC_word_t)(uVar1 >> 0x20);
  *r0 = (tc_uECC_word_t)uVar1;
  return;
}

Assistant:

static void muladd(tc_uECC_word_t a, tc_uECC_word_t b, tc_uECC_word_t *r0,
		   tc_uECC_word_t *r1, tc_uECC_word_t *r2)
{

	tc_uECC_dword_t p = (tc_uECC_dword_t)a * b;
	tc_uECC_dword_t r01 = ((tc_uECC_dword_t)(*r1) << tc_uECC_WORD_BITS) | *r0;
	r01 += p;
	*r2 += (r01 < p);
	*r1 = r01 >> tc_uECC_WORD_BITS;
	*r0 = (tc_uECC_word_t)r01;

}